

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imageadapter.h
# Opt level: O2

string * __thiscall
bgui::ImageAdapter<float>::getDescriptionOfPixel_abi_cxx11_
          (string *__return_storage_ptr__,ImageAdapter<float> *this,long x,long y)

{
  double dVar1;
  ostream *poVar2;
  int d;
  long lVar3;
  SVector<long,_2> p;
  ostringstream os;
  undefined1 local_1c8 [40];
  long local_1a0 [2];
  undefined8 auStack_190 [45];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  dVar1 = (this->super_ImageAdapterBase).scale;
  local_1c8._16_8_ = (undefined8)((double)x / dVar1);
  local_1c8._24_8_ = (undefined8)((double)y / dVar1);
  local_1c8._32_8_ = 1;
  gmath::SMatrix<long,_2,_3>::operator*
            ((SMatrix<long,_2,_3> *)local_1c8,(SVector<long,_3> *)&(this->super_ImageAdapterBase).R)
  ;
  std::operator<<((ostream *)local_1a0,"x=");
  *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 5;
  poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
  std::operator<<(poVar2,", y=");
  *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 5;
  poVar2 = std::ostream::_M_insert<long>((long)local_1a0);
  std::operator<<(poVar2,":");
  for (lVar3 = 0; lVar3 < this->image->depth; lVar3 = lVar3 + 1) {
    std::operator<<((ostream *)local_1a0," ");
    *(undefined8 *)((long)auStack_190 + *(long *)(local_1a0[0] + -0x18)) = 5;
    std::ostream::operator<<
              ((ostream *)local_1a0,this->image->img[lVar3][local_1c8._8_8_][local_1c8._0_8_]);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string getDescriptionOfPixel(long x, long y) const
    {
      std::ostringstream os;

      x=static_cast<long>(x/scale);
      y=static_cast<long>(y/scale);

      gmath::SVector<long, 2> p=R*gmath::SVector<long, 3>(x, y, 1);

      os << "x=";

      os.width(5);
      os << p[0] << ", y=";

      os.width(5);
      os << p[1] << ":";

      for (int d=0; d<image->getDepth(); d++)
      {
        os << " ";

        os.width(5);
        os << image->getW(p[0], p[1], d);
      }

      return os.str();
    }